

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

string * fs_win32_final_path_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view path_00;
  error_code eVar1;
  string_view local_60;
  error_category *local_50;
  char *local_48;
  int local_40;
  undefined4 uStack_3c;
  error_category *local_38;
  undefined1 local_30 [8];
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)local_30);
  eVar1 = std::make_error_code(function_not_supported);
  local_38 = eVar1._M_cat;
  local_40 = eVar1._M_value;
  local_30._4_4_ = uStack_3c;
  local_30._0_4_ = local_40;
  local_50 = ec._M_cat;
  local_48 = path._M_str;
  ec._0_8_ = local_38;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"fs_win32_final_path");
  path_00._M_str = local_48;
  path_00._M_len = (size_t)local_50;
  fs_print_error(path_00,local_60,(error_code *)local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_win32_final_path(std::string_view path)
{
  // resolves Windows symbolic links (reparse points and junctions)
  // it also resolves the case insensitivity of Windows paths to the disk case
  // PATH MUST EXIST
  //
  // References:
  // https://stackoverflow.com/a/50182947
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-createfilea
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getfinalpathnamebyhandlea

  std::error_code ec;

#if defined(_WIN32)
  if(fs_trace) std::cout << "TRACE: win32_final_path(" << path << ")\n";
  // dwDesiredAccess=0 to allow getting parameters even without read permission
  // FILE_FLAG_BACKUP_SEMANTICS required to open a directory
  HANDLE h = CreateFileA(path.data(), GENERIC_READ, FILE_SHARE_READ, nullptr,
              OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if(h == INVALID_HANDLE_VALUE)
    return {};

  std::string r(fs_get_max_path(), '\0');

  if(DWORD L = GetFinalPathNameByHandleA(h, r.data(), static_cast<DWORD>(r.size()), FILE_NAME_NORMALIZED);
      CloseHandle(h) && L) {
    r.resize(L);

#ifdef __cpp_lib_starts_ends_with  // C++20
    if (r.starts_with(R"(\\?\)"))
#else  // C++98
    if (r.substr(0, 4) == R"(\\?\)")
#endif
      r = r.substr(4);

    return fs_as_posix(r);
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}